

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O3

String * __thiscall
glcts::AtomicCounterLayoutBindingCase::buildAccess
          (String *__return_storage_ptr__,AtomicCounterLayoutBindingCase *this,String *var)

{
  ostream *poVar1;
  ostringstream s;
  undefined1 local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"vec4(float(atomicCounter(",0x19);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_190,(var->_M_dataplus)._M_p,var->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")), 1.0, 0.0, 1.0)",0x12);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  std::ios_base::~ios_base((ios_base *)(local_190 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

String buildAccess(const String& var)
	{
		std::ostringstream s;
		s << "vec4(float(atomicCounter(" << var << ")), 1.0, 0.0, 1.0)";
		return s.str();
	}